

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O0

int __thiscall ZXing::Pdf417::BarcodeMatrix::init(BarcodeMatrix *this,EVP_PKEY_CTX *ctx)

{
  reference this_00;
  int in_EDX;
  vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_> *unaff_retaddr;
  int i;
  int local_14;
  
  std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::resize
            (unaff_retaddr,(size_type)this);
  for (local_14 = 0; local_14 < (int)ctx; local_14 = local_14 + 1) {
    this_00 = std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::
              operator[](&this->_matrix,(long)local_14);
    BarcodeRow::init(this_00,(EVP_PKEY_CTX *)(ulong)((in_EDX + 4) * 0x11 + 1));
  }
  this->_width = in_EDX * 0x11;
  this->_currentRow = -1;
  return (int)this;
}

Assistant:

void init(int height, int width) {
		_matrix.resize(height);
		for (int i = 0; i < height; ++i) {
			_matrix[i].init((width + 4) * 17 + 1);
		}
		_width = width * 17;
		_currentRow = -1;
	}